

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::PrefixUnaryExpressionSyntax::setChild
          (PrefixUnaryExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined4 uVar1;
  SyntaxNode *pSVar2;
  SyntaxNode *pSVar3;
  Token TVar4;
  
  if (index == 2) {
    pSVar3 = TokenOrSyntax::node(&child);
    if (pSVar3 == (SyntaxNode *)0x0) {
      pSVar3 = (SyntaxNode *)0x0;
    }
    else {
      pSVar3 = TokenOrSyntax::node(&child);
    }
    (this->operand).ptr = (ExpressionSyntax *)pSVar3;
  }
  else if (index == 1) {
    pSVar2 = TokenOrSyntax::node(&child);
    uVar1 = *(undefined4 *)&pSVar2->field_0x4;
    pSVar3 = pSVar2->parent;
    (this->attributes).super_SyntaxListBase.super_SyntaxNode.kind = pSVar2->kind;
    *(undefined4 *)&(this->attributes).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar1;
    (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
    (this->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar2->previewNode;
    (this->attributes).super_SyntaxListBase.childCount = *(size_t *)(pSVar2 + 1);
    pSVar3 = pSVar2[1].previewNode;
    (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
    _M_ptr = (pointer)pSVar2[1].parent;
    (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
    _M_extent._M_extent_value = (size_t)pSVar3;
  }
  else {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->operatorToken).kind = TVar4.kind;
    (this->operatorToken).field_0x2 = TVar4._2_1_;
    (this->operatorToken).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->operatorToken).rawLen = TVar4.rawLen;
    (this->operatorToken).info = TVar4.info;
  }
  return;
}

Assistant:

void PrefixUnaryExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: operatorToken = child.token(); return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: operand = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}